

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBufferPool::~VulkanCommandBufferPool(VulkanCommandBufferPool *this)

{
  VkCommandBuffer CmdBuffer;
  bool bVar1;
  __int_type _Var2;
  Char *Message;
  reference ppVVar3;
  element_type *this_00;
  VkCommandPool_T *Pool;
  char (*in_RCX) [236];
  VkCommandBuffer_T *CmdBuff;
  iterator __end1;
  iterator __begin1;
  deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> *__range1;
  string msg;
  VulkanCommandBufferPool *this_local;
  
  msg.field_2._8_8_ = this;
  _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&this->m_BuffCounter);
  if (_Var2 != 0) {
    Diligent::FormatString<std::atomic<int>,char[236]>
              ((string *)&__range1,(Diligent *)&this->m_BuffCounter,
               (atomic<int> *)
               " command buffer(s) have not been returned to the pool. If there are outstanding references to these buffers in release queues, VulkanCommandBufferPool::RecycleCommandBuffer() will crash when attempting to return the buffer to the pool."
               ,in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"~VulkanCommandBufferPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanCommandBufferPool.cpp"
               ,0x3c);
    std::__cxx11::string::~string((string *)&__range1);
  }
  std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::begin
            ((iterator *)&__end1._M_node,&this->m_CmdBuffers);
  std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::end
            ((iterator *)&CmdBuff,&this->m_CmdBuffers);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&CmdBuff);
    if (!bVar1) break;
    ppVVar3 = std::_Deque_iterator<VkCommandBuffer_T_*,_VkCommandBuffer_T_*&,_VkCommandBuffer_T_**>
              ::operator*((_Deque_iterator<VkCommandBuffer_T_*,_VkCommandBuffer_T_*&,_VkCommandBuffer_T_**>
                           *)&__end1._M_node);
    CmdBuffer = *ppVVar3;
    this_00 = std::
              __shared_ptr_access<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this);
    Pool = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkCommandPool_T_
                     ((VulkanObjectWrapper *)&this->m_CmdPool);
    VulkanLogicalDevice::FreeCommandBuffer(this_00,Pool,CmdBuffer);
    std::_Deque_iterator<VkCommandBuffer_T_*,_VkCommandBuffer_T_*&,_VkCommandBuffer_T_**>::
    operator++((_Deque_iterator<VkCommandBuffer_T_*,_VkCommandBuffer_T_*&,_VkCommandBuffer_T_**> *)
               &__end1._M_node);
  }
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::Release
            (&this->m_CmdPool);
  std::deque<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::~deque(&this->m_CmdBuffers)
  ;
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
  ~VulkanObjectWrapper(&this->m_CmdPool);
  std::shared_ptr<const_VulkanUtilities::VulkanLogicalDevice>::~shared_ptr(&this->m_LogicalDevice);
  return;
}

Assistant:

VulkanCommandBufferPool::~VulkanCommandBufferPool()
{
    DEV_CHECK_ERR(m_BuffCounter == 0, m_BuffCounter,
                  " command buffer(s) have not been returned to the pool. If there are outstanding references to these "
                  "buffers in release queues, VulkanCommandBufferPool::RecycleCommandBuffer() will crash when attempting to "
                  "return the buffer to the pool.");

    for (auto CmdBuff : m_CmdBuffers)
        m_LogicalDevice->FreeCommandBuffer(m_CmdPool, CmdBuff);
    m_CmdPool.Release();
}